

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O0

ARTKey duckdb::ARTKey::CreateARTKey<duckdb::string_t>(ArenaAllocator *allocator,string_t value)

{
  char *src;
  const_data_ptr_t pdVar1;
  idx_t iVar2;
  data_ptr_t data;
  long lVar3;
  idx_t i_1;
  idx_t pos;
  data_ptr_t key_data;
  idx_t key_len;
  idx_t i;
  idx_t escape_count;
  idx_t string_len;
  const_data_ptr_t string_data;
  ulong local_68;
  string_t *in_stack_ffffffffffffffa0;
  long lVar4;
  ulong len;
  ArenaAllocator *this;
  string_t local_20;
  ARTKey local_10;
  
  src = string_t::GetData(in_stack_ffffffffffffffa0);
  pdVar1 = const_data_ptr_cast<char>(src);
  iVar2 = string_t::GetSize(&local_20);
  this = (ArenaAllocator *)0x0;
  for (len = 0; len < iVar2; len = len + 1) {
    if (pdVar1[len] < 2) {
      this = (ArenaAllocator *)((long)&this->allocator + 1);
    }
  }
  data = ArenaAllocator::Allocate(this,len);
  lVar4 = 0;
  for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
    lVar3 = lVar4;
    if (pdVar1[local_68] < 2) {
      lVar3 = lVar4 + 1;
      data[lVar4] = '\x01';
    }
    lVar4 = lVar3 + 1;
    data[lVar3] = pdVar1[local_68];
  }
  data[lVar4] = '\0';
  ARTKey(&local_10,data,(long)&this->allocator + iVar2 + 1);
  return local_10;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, string_t value) {
	auto string_data = const_data_ptr_cast(value.GetData());
	auto string_len = value.GetSize();

	// We escape \00 and \01.
	idx_t escape_count = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			escape_count++;
		}
	}

	idx_t key_len = string_len + escape_count + 1;
	auto key_data = allocator.Allocate(key_len);

	// Copy over the data and add escapes.
	idx_t pos = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			// Add escape.
			key_data[pos++] = '\01';
		}
		key_data[pos++] = string_data[i];
	}

	// End with a null-terminator.
	key_data[pos] = '\0';
	return ARTKey(key_data, key_len);
}